

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O3

void ascon_hash_xof(uint8_t *digest,uint8_t *data,size_t digest_len,size_t data_len)

{
  ascon_hash_ctx_t ctx;
  ascon_bufstate_t local_58;
  
  local_58.sponge.x0 = 0xb57e273b814cd416;
  local_58.sponge.x1 = 0x2b51042562ae2420;
  local_58.sponge.x2 = 0x66a3a7768ddf2218;
  local_58.sponge.x3 = 0x5aad0a7a8153650c;
  local_58.sponge.x4 = 0x4f3e0e32539493b6;
  local_58.buffer_len = '\0';
  local_58.flow_state = '\x01';
  buffered_accumulation(&local_58,(uint8_t *)0x0,data,absorb_hash_data,data_len,'\b');
  local_58.flow_state = '\x02';
  hash_final(ascon_permutation_12,&local_58,digest,digest_len);
  return;
}

Assistant:

ASCON_API void
ascon_hash_xof(uint8_t* const digest,
               const uint8_t* const data,
               const size_t digest_len,
               const size_t data_len)
{
    ASCON_ASSERT(digest_len == 0 || digest != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ascon_hash_ctx_t ctx;
    ascon_hash_xof_init(&ctx);
    ascon_hash_xof_update(&ctx, data, data_len);
    ascon_hash_xof_final(&ctx, digest, digest_len);
}